

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFDebugMacro.cpp
# Opt level: O0

void __thiscall llvm::DWARFDebugMacro::dump(DWARFDebugMacro *this,raw_ostream *OS)

{
  uint32_t uVar1;
  bool bVar2;
  raw_ostream *prVar3;
  StringRef Str;
  WithColor local_78;
  uint local_64;
  const_iterator pEStack_60;
  uint I;
  Entry *E;
  const_iterator __end2;
  const_iterator __begin2;
  SmallVector<llvm::DWARFDebugMacro::Entry,_4U> *__range2;
  SmallVector<llvm::DWARFDebugMacro::Entry,_4U> *Macros;
  const_iterator __end1;
  const_iterator __begin1;
  vector<llvm::SmallVector<llvm::DWARFDebugMacro::Entry,_4U>,_std::allocator<llvm::SmallVector<llvm::DWARFDebugMacro::Entry,_4U>_>_>
  *__range1;
  uint IndLevel;
  raw_ostream *OS_local;
  DWARFDebugMacro *this_local;
  
  __range1._4_4_ = 0;
  __end1 = std::
           vector<llvm::SmallVector<llvm::DWARFDebugMacro::Entry,_4U>,_std::allocator<llvm::SmallVector<llvm::DWARFDebugMacro::Entry,_4U>_>_>
           ::begin(&this->MacroLists);
  Macros = (SmallVector<llvm::DWARFDebugMacro::Entry,_4U> *)
           std::
           vector<llvm::SmallVector<llvm::DWARFDebugMacro::Entry,_4U>,_std::allocator<llvm::SmallVector<llvm::DWARFDebugMacro::Entry,_4U>_>_>
           ::end(&this->MacroLists);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_llvm::SmallVector<llvm::DWARFDebugMacro::Entry,_4U>_*,_std::vector<llvm::SmallVector<llvm::DWARFDebugMacro::Entry,_4U>,_std::allocator<llvm::SmallVector<llvm::DWARFDebugMacro::Entry,_4U>_>_>_>
                                     *)&Macros), bVar2) {
    __begin2 = (const_iterator)
               __gnu_cxx::
               __normal_iterator<const_llvm::SmallVector<llvm::DWARFDebugMacro::Entry,_4U>_*,_std::vector<llvm::SmallVector<llvm::DWARFDebugMacro::Entry,_4U>,_std::allocator<llvm::SmallVector<llvm::DWARFDebugMacro::Entry,_4U>_>_>_>
               ::operator*(&__end1);
    __range2 = (SmallVector<llvm::DWARFDebugMacro::Entry,_4U> *)__begin2;
    __end2 = SmallVectorTemplateCommon<llvm::DWARFDebugMacro::Entry,_void>::begin
                       ((SmallVectorTemplateCommon<llvm::DWARFDebugMacro::Entry,_void> *)__begin2);
    E = SmallVectorTemplateCommon<llvm::DWARFDebugMacro::Entry,_void>::end
                  ((SmallVectorTemplateCommon<llvm::DWARFDebugMacro::Entry,_void> *)__begin2);
    for (; __end2 != E; __end2 = __end2 + 1) {
      pEStack_60 = __end2;
      if (__range1._4_4_ != 0) {
        __range1._4_4_ = __range1._4_4_ - (__end2->Type == 4);
      }
      for (local_64 = 0; local_64 < __range1._4_4_; local_64 = local_64 + 1) {
        raw_ostream::operator<<(OS,"  ");
      }
      __range1._4_4_ = __range1._4_4_ + (pEStack_60->Type == 3);
      WithColor::WithColor(&local_78,OS,Macro,false);
      prVar3 = WithColor::get(&local_78);
      Str = dwarf::MacinfoString(pEStack_60->Type);
      raw_ostream::operator<<(prVar3,Str);
      WithColor::~WithColor(&local_78);
      uVar1 = pEStack_60->Type;
      if (uVar1 - 1 < 2) {
        prVar3 = raw_ostream::operator<<(OS," - lineno: ");
        raw_ostream::operator<<(prVar3,(pEStack_60->field_1).Line);
        prVar3 = raw_ostream::operator<<(OS," macro: ");
        raw_ostream::operator<<(prVar3,(pEStack_60->field_2).MacroStr);
      }
      else if (uVar1 == 3) {
        prVar3 = raw_ostream::operator<<(OS," - lineno: ");
        raw_ostream::operator<<(prVar3,(pEStack_60->field_1).Line);
        prVar3 = raw_ostream::operator<<(OS," filenum: ");
        raw_ostream::operator<<(prVar3,(pEStack_60->field_2).File);
      }
      else if ((uVar1 != 4) && (uVar1 == 0xff)) {
        prVar3 = raw_ostream::operator<<(OS," - constant: ");
        raw_ostream::operator<<(prVar3,(pEStack_60->field_1).Line);
        prVar3 = raw_ostream::operator<<(OS," string: ");
        raw_ostream::operator<<(prVar3,(pEStack_60->field_2).MacroStr);
      }
      raw_ostream::operator<<(OS,"\n");
    }
    raw_ostream::operator<<(OS,"\n");
    __gnu_cxx::
    __normal_iterator<const_llvm::SmallVector<llvm::DWARFDebugMacro::Entry,_4U>_*,_std::vector<llvm::SmallVector<llvm::DWARFDebugMacro::Entry,_4U>,_std::allocator<llvm::SmallVector<llvm::DWARFDebugMacro::Entry,_4U>_>_>_>
    ::operator++(&__end1);
  }
  return;
}

Assistant:

void DWARFDebugMacro::dump(raw_ostream &OS) const {
  unsigned IndLevel = 0;
  for (const auto &Macros : MacroLists) {
    for (const Entry &E : Macros) {
      // There should not be DW_MACINFO_end_file when IndLevel is Zero. However,
      // this check handles the case of corrupted ".debug_macinfo" section.
      if (IndLevel > 0)
        IndLevel -= (E.Type == DW_MACINFO_end_file);
      // Print indentation.
      for (unsigned I = 0; I < IndLevel; I++)
        OS << "  ";
      IndLevel += (E.Type == DW_MACINFO_start_file);

      WithColor(OS, HighlightColor::Macro).get() << MacinfoString(E.Type);
      switch (E.Type) {
      default:
        // Got a corrupted ".debug_macinfo" section (invalid macinfo type).
        break;
      case DW_MACINFO_define:
      case DW_MACINFO_undef:
        OS << " - lineno: " << E.Line;
        OS << " macro: " << E.MacroStr;
        break;
      case DW_MACINFO_start_file:
        OS << " - lineno: " << E.Line;
        OS << " filenum: " << E.File;
        break;
      case DW_MACINFO_end_file:
        break;
      case DW_MACINFO_vendor_ext:
        OS << " - constant: " << E.ExtConstant;
        OS << " string: " << E.ExtStr;
        break;
      }
      OS << "\n";
    }
    OS << "\n";
  }
}